

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  FieldDescriptor *this;
  char *pcVar1;
  double dVar2;
  pointer ppFVar3;
  bool bVar4;
  int iVar5;
  int32_t iVar6;
  uint32_t uVar7;
  Nullable<const_char_*> pcVar8;
  Reflection *this_00;
  Reflection *this_01;
  MessageFactory *pMVar9;
  MessageFactory *pMVar10;
  MessageFactory *pMVar11;
  MessageFactory *pMVar12;
  MapFieldBase *this_02;
  MapFieldBase *this_03;
  Message *pMVar13;
  uint64_t uVar14;
  EnumValueDescriptor *pEVar15;
  int64_t iVar16;
  Message *pMVar17;
  UnknownFieldSet *pUVar18;
  UnknownFieldSet *other;
  LogMessage *pLVar19;
  pointer ppFVar20;
  int index;
  float fVar21;
  Metadata MVar22;
  string_view v;
  string_view v_00;
  Message *to_local;
  Message *local_c0;
  Reflection *local_b8;
  char local_a9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Descriptor *descriptor;
  string local_70;
  string local_50;
  
  to_local = to;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)from;
  pcVar8 = absl::lts_20250127::log_internal::
           Check_NEImpl<google::protobuf::Message_const*,google::protobuf::Message*>
                     ((Message **)&fields,&to_local,"&from != to");
  if (pcVar8 != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&fields,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x33,pcVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&fields);
  }
  MVar22 = Message::GetMetadata(from);
  descriptor = MVar22.descriptor;
  MVar22 = Message::GetMetadata(to_local);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)MVar22.descriptor;
  pcVar8 = absl::lts_20250127::log_internal::
           Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                     ((Descriptor **)&fields,&descriptor,"to->GetDescriptor() == descriptor");
  if (pcVar8 != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&fields,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x36,pcVar8);
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        ((LogMessage *)&fields,
                         (char (*) [44])"Tried to merge messages of different types ");
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar19,(char (*) [8])"(merge ");
    pcVar1 = (descriptor->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v._M_str = pcVar1 + ~v._M_len;
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar19,v);
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar19,(char (*) [5])0x44c0b9);
    MVar22 = Message::GetMetadata(to_local);
    pcVar1 = ((MVar22.descriptor)->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v_00._M_str = pcVar1 + ~v_00._M_len;
    pLVar19 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar19,v_00);
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar19,(char (*) [2])0x34cb87);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&fields);
  }
  this_00 = GetReflectionOrDie(from);
  this_01 = GetReflectionOrDie(to_local);
  pMVar9 = Reflection::GetMessageFactory(this_00);
  pMVar10 = MessageFactory::generated_factory();
  local_b8 = this_01;
  pMVar11 = Reflection::GetMessageFactory(this_01);
  pMVar12 = MessageFactory::generated_factory();
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = from;
  Reflection::ListFields(this_00,from,&fields);
  ppFVar3 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_a9 = (pMVar11 != pMVar12) != (pMVar9 == pMVar10);
  ppFVar20 = fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar20 == ppFVar3) {
      pUVar18 = Reflection::GetUnknownFields(this_00,local_c0);
      bVar4 = RepeatedField<google::protobuf::UnknownField>::empty(&pUVar18->fields_);
      if (!bVar4) {
        pUVar18 = Reflection::MutableUnknownFields(local_b8,to_local);
        other = Reflection::GetUnknownFields(this_00,local_c0);
        UnknownFieldSet::MergeFrom(pUVar18,other);
      }
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     );
      return;
    }
    this = *ppFVar20;
    bVar4 = FieldDescriptor::is_repeated(this);
    pMVar17 = to_local;
    if (bVar4) {
      if ((local_a9 != '\0') && (bVar4 = FieldDescriptor::is_map(this), bVar4)) {
        this_02 = Reflection::GetMapData(this_00,local_c0,this);
        this_03 = Reflection::MutableMapData(local_b8,to_local,this);
        bVar4 = MapFieldBase::IsMapValid(this_03);
        if ((bVar4) && (bVar4 = MapFieldBase::IsMapValid(this_02), bVar4)) {
          MapFieldBase::MergeFrom(this_03,this_02);
          goto switchD_002a4304_default;
        }
      }
      iVar5 = Reflection::FieldSize(this_00,local_c0,this);
      index = 0;
      if (iVar5 < 1) {
        iVar5 = index;
      }
      for (; pMVar17 = to_local, iVar5 != index; index = index + 1) {
        switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4)) {
        case 1:
          iVar6 = Reflection::GetRepeatedInt32(this_00,local_c0,this,index);
          Reflection::AddInt32(local_b8,pMVar17,this,iVar6);
          break;
        case 2:
          iVar16 = Reflection::GetRepeatedInt64(this_00,local_c0,this,index);
          Reflection::AddInt64(local_b8,pMVar17,this,iVar16);
          break;
        case 3:
          uVar7 = Reflection::GetRepeatedUInt32(this_00,local_c0,this,index);
          Reflection::AddUInt32(local_b8,pMVar17,this,uVar7);
          break;
        case 4:
          uVar14 = Reflection::GetRepeatedUInt64(this_00,local_c0,this,index);
          Reflection::AddUInt64(local_b8,pMVar17,this,uVar14);
          break;
        case 5:
          dVar2 = Reflection::GetRepeatedDouble(this_00,local_c0,this,index);
          Reflection::AddDouble(local_b8,pMVar17,this,dVar2);
          break;
        case 6:
          fVar21 = Reflection::GetRepeatedFloat(this_00,local_c0,this,index);
          Reflection::AddFloat(local_b8,pMVar17,this,fVar21);
          break;
        case 7:
          bVar4 = Reflection::GetRepeatedBool(this_00,local_c0,this,index);
          Reflection::AddBool(local_b8,pMVar17,this,bVar4);
          break;
        case 8:
          pEVar15 = Reflection::GetRepeatedEnum(this_00,local_c0,this,index);
          Reflection::AddEnum(local_b8,pMVar17,this,pEVar15);
          break;
        case 9:
          Reflection::GetRepeatedString_abi_cxx11_(&local_50,this_00,local_c0,this,index);
          Reflection::AddString(local_b8,pMVar17,this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          break;
        case 10:
          pMVar13 = Reflection::GetRepeatedMessage(this_00,local_c0,this,index);
          pMVar17 = to_local;
          if (this_00 == local_b8) {
            MVar22 = Message::GetMetadata(pMVar13);
            pMVar9 = Reflection::GetMessageFactory(MVar22.reflection);
          }
          else {
            pMVar9 = (MessageFactory *)0x0;
          }
          pMVar17 = Reflection::AddMessage(local_b8,pMVar17,this,pMVar9);
          Message::MergeFrom(pMVar17,pMVar13);
        }
      }
    }
    else {
      switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4)) {
      case 1:
        iVar6 = Reflection::GetInt32(this_00,local_c0,this);
        Reflection::SetInt32(local_b8,pMVar17,this,iVar6);
        break;
      case 2:
        iVar16 = Reflection::GetInt64(this_00,local_c0,this);
        Reflection::SetInt64(local_b8,pMVar17,this,iVar16);
        break;
      case 3:
        uVar7 = Reflection::GetUInt32(this_00,local_c0,this);
        Reflection::SetUInt32(local_b8,pMVar17,this,uVar7);
        break;
      case 4:
        uVar14 = Reflection::GetUInt64(this_00,local_c0,this);
        Reflection::SetUInt64(local_b8,pMVar17,this,uVar14);
        break;
      case 5:
        dVar2 = Reflection::GetDouble(this_00,local_c0,this);
        Reflection::SetDouble(local_b8,pMVar17,this,dVar2);
        break;
      case 6:
        fVar21 = Reflection::GetFloat(this_00,local_c0,this);
        Reflection::SetFloat(local_b8,pMVar17,this,fVar21);
        break;
      case 7:
        bVar4 = Reflection::GetBool(this_00,local_c0,this);
        Reflection::SetBool(local_b8,pMVar17,this,bVar4);
        break;
      case 8:
        pEVar15 = Reflection::GetEnum(this_00,local_c0,this);
        Reflection::SetEnum(local_b8,pMVar17,this,pEVar15);
        break;
      case 9:
        Reflection::GetString_abi_cxx11_(&local_70,this_00,local_c0,this);
        Reflection::SetString(local_b8,pMVar17,this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        break;
      case 10:
        pMVar13 = Reflection::GetMessage(this_00,local_c0,this,(MessageFactory *)0x0);
        pMVar17 = to_local;
        if (this_00 == local_b8) {
          MVar22 = Message::GetMetadata(pMVar13);
          pMVar9 = Reflection::GetMessageFactory(MVar22.reflection);
        }
        else {
          pMVar9 = (MessageFactory *)0x0;
        }
        pMVar17 = Reflection::MutableMessage(local_b8,pMVar17,this,pMVar9);
        Message::MergeFrom(pMVar17,pMVar13);
      }
    }
switchD_002a4304_default:
    ppFVar20 = ppFVar20 + 1;
  } while( true );
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  ABSL_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  ABSL_CHECK_EQ(to->GetDescriptor(), descriptor)
      << "Tried to merge messages of different types "
      << "(merge " << descriptor->full_name() << " to "
      << to->GetDescriptor()->full_name() << ")";

  const Reflection* from_reflection = GetReflectionOrDie(from);
  const Reflection* to_reflection = GetReflectionOrDie(*to);
  bool is_from_generated = (from_reflection->GetMessageFactory() ==
                            google::protobuf::MessageFactory::generated_factory());
  bool is_to_generated = (to_reflection->GetMessageFactory() ==
                          google::protobuf::MessageFactory::generated_factory());

  std::vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->is_repeated()) {
      // Use map reflection if both are in map status and have the
      // same map type to avoid sync with repeated field.
      // Note: As from and to messages have the same descriptor, the
      // map field types are the same if they are both generated
      // messages or both dynamic messages.
      if (is_from_generated == is_to_generated && field->is_map()) {
        const MapFieldBase* from_field =
            from_reflection->GetMapData(from, field);
        MapFieldBase* to_field = to_reflection->MutableMapData(to, field);
        if (to_field->IsMapValid() && from_field->IsMapValid()) {
          to_field->MergeFrom(*from_field);
          continue;
        }
      }
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    to_reflection->Add##METHOD(                                           \
        to, field, from_reflection->GetRepeated##METHOD(from, field, j)); \
    break;

          HANDLE_TYPE(INT32, Int32);
          HANDLE_TYPE(INT64, Int64);
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT, Float);
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL, Bool);
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            const Message& from_child =
                from_reflection->GetRepeatedMessage(from, field, j);
            if (from_reflection == to_reflection) {
              to_reflection
                  ->AddMessage(to, field,
                               from_child.GetReflection()->GetMessageFactory())
                  ->MergeFrom(from_child);
            } else {
              to_reflection->AddMessage(to, field)->MergeFrom(from_child);
            }
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                       \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                 \
    to_reflection->Set##METHOD(to, field,                                  \
                               from_reflection->Get##METHOD(from, field)); \
    break;

        HANDLE_TYPE(INT32, Int32);
        HANDLE_TYPE(INT64, Int64);
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          const Message& from_child = from_reflection->GetMessage(from, field);
          if (from_reflection == to_reflection) {
            to_reflection
                ->MutableMessage(
                    to, field, from_child.GetReflection()->GetMessageFactory())
                ->MergeFrom(from_child);
          } else {
            to_reflection->MutableMessage(to, field)->MergeFrom(from_child);
          }
          break;
      }
    }
  }

  if (!from_reflection->GetUnknownFields(from).empty()) {
    to_reflection->MutableUnknownFields(to)->MergeFrom(
        from_reflection->GetUnknownFields(from));
  }
}